

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

char * spvOpcodeString(uint32_t opcode)

{
  spv_opcode_desc_t *psVar1;
  spv_opcode_desc_t *it;
  char *pcStack_a8;
  anon_class_1_0_00000001_for__M_comp comp;
  spv_opcode_desc_t needle;
  spv_opcode_desc_t *end;
  spv_opcode_desc_t *beg;
  uint32_t opcode_local;
  
  memset(&stack0xffffffffffffff58,0,0x88);
  pcStack_a8 = "";
  psVar1 = std::lower_bound<spv_opcode_desc_t_const*,spv_opcode_desc_t,spvOpcodeString::__0>
                     ((anonymous_namespace)::kOpcodeTableEntries,&DAT_013ed548,
                      &stack0xffffffffffffff58);
  if ((psVar1 != (spv_opcode_desc_t *)&DAT_013ed548) && (psVar1->opcode == opcode)) {
    return psVar1->name;
  }
  __assert_fail("0 && \"Unreachable!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opcode.cpp"
                ,0xe1,"const char *spvOpcodeString(const uint32_t)");
}

Assistant:

const char* spvOpcodeString(const uint32_t opcode) {
  const auto beg = kOpcodeTableEntries;
  const auto end = kOpcodeTableEntries + ARRAY_SIZE(kOpcodeTableEntries);
  spv_opcode_desc_t needle = {"",    static_cast<spv::Op>(opcode),
                              0,     nullptr,
                              0,     {},
                              0,     {},
                              false, false,
                              0,     nullptr,
                              ~0u,   ~0u};
  auto comp = [](const spv_opcode_desc_t& lhs, const spv_opcode_desc_t& rhs) {
    return lhs.opcode < rhs.opcode;
  };
  auto it = std::lower_bound(beg, end, needle, comp);
  if (it != end && it->opcode == spv::Op(opcode)) {
    return it->name;
  }

  assert(0 && "Unreachable!");
  return "unknown";
}